

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O2

void tt_get_metrics_incr_overrides(TT_Loader loader,FT_UInt glyph_index)

{
  FT_Incremental_InterfaceRec *pFVar1;
  FT_Incremental_GetGlyphMetricsFunc p_Var2;
  FT_Error FVar3;
  FT_Incremental_MetricsRec incr_metrics;
  FT_Incremental_MetricsRec local_28;
  
  pFVar1 = ((loader->face->root).internal)->incremental_interface;
  if ((pFVar1 != (FT_Incremental_InterfaceRec *)0x0) &&
     (p_Var2 = pFVar1->funcs->get_glyph_metrics, p_Var2 != (FT_Incremental_GetGlyphMetricsFunc)0x0))
  {
    local_28.bearing_x = (FT_Long)loader->left_bearing;
    local_28.bearing_y = 0;
    local_28.advance = (FT_Long)loader->advance;
    local_28.advance_v = 0;
    FVar3 = (*p_Var2)(pFVar1->object,glyph_index,'\0',&local_28);
    if (FVar3 == 0) {
      loader->left_bearing = (int)(short)local_28.bearing_x;
      loader->advance = (uint)(ushort)local_28.advance;
      loader->top_bearing = 0;
      loader->vadvance = 0;
      if (loader->linear_def == '\0') {
        loader->linear_def = '\x01';
        loader->linear = (uint)(ushort)local_28.advance;
      }
    }
  }
  return;
}

Assistant:

static void
  tt_get_metrics_incr_overrides( TT_Loader  loader,
                                 FT_UInt    glyph_index )
  {
    TT_Face  face = loader->face;

    FT_Short   left_bearing = 0, top_bearing = 0;
    FT_UShort  advance_width = 0, advance_height = 0;


    /* If this is an incrementally loaded font check whether there are */
    /* overriding metrics for this glyph.                              */
    if ( face->root.internal->incremental_interface                           &&
         face->root.internal->incremental_interface->funcs->get_glyph_metrics )
    {
      FT_Incremental_MetricsRec  incr_metrics;
      FT_Error                   error;


      incr_metrics.bearing_x = loader->left_bearing;
      incr_metrics.bearing_y = 0;
      incr_metrics.advance   = loader->advance;
      incr_metrics.advance_v = 0;

      error = face->root.internal->incremental_interface->funcs->get_glyph_metrics(
                face->root.internal->incremental_interface->object,
                glyph_index, FALSE, &incr_metrics );
      if ( error )
        goto Exit;

      left_bearing  = (FT_Short)incr_metrics.bearing_x;
      advance_width = (FT_UShort)incr_metrics.advance;

#if 0

      /* GWW: Do I do the same for vertical metrics? */
      incr_metrics.bearing_x = 0;
      incr_metrics.bearing_y = loader->top_bearing;
      incr_metrics.advance   = loader->vadvance;

      error = face->root.internal->incremental_interface->funcs->get_glyph_metrics(
                face->root.internal->incremental_interface->object,
                glyph_index, TRUE, &incr_metrics );
      if ( error )
        goto Exit;

      top_bearing    = (FT_Short)incr_metrics.bearing_y;
      advance_height = (FT_UShort)incr_metrics.advance;

#endif /* 0 */

      loader->left_bearing = left_bearing;
      loader->advance      = advance_width;
      loader->top_bearing  = top_bearing;
      loader->vadvance     = advance_height;

      if ( !loader->linear_def )
      {
        loader->linear_def = 1;
        loader->linear     = advance_width;
      }
    }

  Exit:
    return;
  }